

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O3

void __thiscall Assimp::StreamWriter<false,_false>::~StreamWriter(StreamWriter<false,_false> *this)

{
  element_type *peVar1;
  pointer puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*peVar1->_vptr_IOStream[3])
            (peVar1,puVar2,1,
             (long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
  (*((this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_IOStream[7])();
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  this_00 = (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~StreamWriter() {
        stream->Write(buffer.data(), 1, buffer.size());
        stream->Flush();
    }